

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O1

void PrintEnterBlock(ExpressionGraphContext *ctx,InplaceStr name,ExprBase *node,char *format,...)

{
  uint uVar1;
  TypeBase *pTVar2;
  OutputContext *pOVar3;
  SynBase *syntax;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  char in_AL;
  char *pcVar6;
  ModuleData *pMVar7;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_f8;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b0 = in_R9;
  PrintIndent(ctx);
  if (name.begin != name.end) {
    OutputContext::Print(ctx->output,name.begin,(int)name.end - (int)name.begin);
    OutputContext::Print(ctx->output,": ",2);
  }
  pTVar2 = node->type;
  if ((pTVar2 != (TypeBase *)0x0) && (pcVar6 = (pTVar2->name).begin, pcVar6 != (pTVar2->name).end))
  {
    OutputContext::Print(ctx->output,pcVar6,*(int *)&(pTVar2->name).end - (int)pcVar6);
    OutputContext::Print(ctx->output," ",1);
  }
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &stack0x00000008;
  local_f8.gp_offset = 0x28;
  local_f8.fp_offset = 0x30;
  OutputContext::Print(ctx->output,format,&local_f8);
  pOVar3 = ctx->output;
  uVar1 = pOVar3->outputBufPos;
  pOVar3->outputBufPos = uVar1 + 1;
  pOVar3->outputBuf[uVar1] = '{';
  if (pOVar3->outputBufPos == pOVar3->outputBufSize) {
    (*pOVar3->writeStream)(pOVar3->stream,pOVar3->outputBuf,pOVar3->outputBufPos);
    pOVar3->outputBufPos = 0;
  }
  syntax = node->source;
  if ((syntax != (SynBase *)0x0) && (syntax->isInternal == false)) {
    pcVar6 = GetParseTreeNodeName(syntax);
    pLVar4 = node->source->begin;
    pLVar5 = node->source->end;
    Print(ctx," // %s [%d:%d]-[%d:%d]",pcVar6,(ulong)(pLVar4->line + 1),(ulong)pLVar4->column,
          (ulong)(pLVar5->line + 1),pLVar5->length + pLVar5->column);
    pMVar7 = ExpressionContext::GetSourceOwner(ctx->ctx,node->source->begin);
    if (pMVar7 != (ModuleData *)0x0) {
      Print(ctx," from \'%.*s\'",
            (ulong)(uint)(*(int *)&(pMVar7->name).end - (int)(pMVar7->name).begin));
    }
  }
  pOVar3 = ctx->output;
  uVar1 = pOVar3->outputBufPos;
  pOVar3->outputBufPos = uVar1 + 1;
  pOVar3->outputBuf[uVar1] = '\n';
  if (pOVar3->outputBufPos == pOVar3->outputBufSize) {
    (*pOVar3->writeStream)(pOVar3->stream,pOVar3->outputBuf,pOVar3->outputBufPos);
    pOVar3->outputBufPos = 0;
  }
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, InplaceStr name, ExprBase *node, const char *format, ...)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(node->type && !node->type->name.empty())
	{
		ctx.output.Print(node->type->name.begin, unsigned(node->type->name.end - node->type->name.begin));
		ctx.output.Print(" ");
	}

	va_list args;
	va_start(args, format);

	ctx.output.Print(format, args);

	va_end(args);

	ctx.output.Print('{');

	if(node->source && !node->source->isInternal)
	{
		Print(ctx, " // %s [%d:%d]-[%d:%d]", GetParseTreeNodeName(node->source), node->source->begin->line + 1, node->source->begin->column, node->source->end->line + 1, node->source->end->column + node->source->end->length);

		if(ModuleData *importModule = ctx.ctx.GetSourceOwner(node->source->begin))
			Print(ctx, " from '%.*s'", FMT_ISTR(importModule->name));
	}

	ctx.output.Print('\n');

	ctx.depth++;
}